

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testInit(XFBTooSmallStrideTest *this)

{
  pointer *pptVar1;
  iterator __position;
  testCase tVar2;
  GLuint c;
  CASES CVar3;
  GLuint stage;
  STAGES SVar4;
  testCase test_case;
  testCase local_30;
  
  CVar3 = OFFSET;
  do {
    SVar4 = COMPUTE;
    do {
      if (SVar4 != FRAGMENT && (SVar4 & FRAGMENT) != COMPUTE) {
        __position._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_30.m_case = CVar3;
          local_30.m_stage = SVar4;
          std::
          vector<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>>
          ::_M_realloc_insert<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase_const&>
                    ((vector<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>>
                      *)&this->m_test_cases,__position,&local_30);
        }
        else {
          tVar2.m_stage = SVar4;
          tVar2.m_case = CVar3;
          *__position._M_current = tVar2;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
      }
      SVar4 = SVar4 + VERTEX;
    } while (SVar4 != STAGE_MAX);
    CVar3 = CVar3 + STRIDE;
  } while (CVar3 != CASE_MAX);
  return;
}

Assistant:

void XFBTooSmallStrideTest::testInit()
{
	for (GLuint c = 0; c < CASE_MAX; ++c)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			/*
			 It is invalid to define transform feedback output in TCS, according to spec:
			 The data captured in transform feedback mode depends on the active programs on each of the shader stages.
			 If a program is active for the geometry shader stage, transform feedback captures the vertices of each
			 primitive emitted by the geometry shader. Otherwise, if a program is active for the tessellation evaluation
			 shader stage, transform feedback captures each primitive produced by the tessellation primitive generator,
			 whose vertices are processed by the tessellation evaluation shader. Otherwise, transform feedback captures
			 each primitive processed by the vertex shader.
			 */
			if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
				(Utils::Shader::FRAGMENT == stage))
			{
				continue;
			}

			testCase test_case = { (CASES)c, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}